

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void duckdb::VerifyNotNullConstraint
               (TableCatalogEntry *table,Vector *vector,idx_t count,string *col_name)

{
  pointer pcVar1;
  ConstraintException *this;
  bool bVar2;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = VectorOperations::HasNull(vector,count);
  if (!bVar2) {
    return;
  }
  this = (ConstraintException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"NOT NULL constraint failed: %s.%s","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
           _M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,
             pcVar1 + (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                      _M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (col_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + col_name->_M_string_length);
  ConstraintException::ConstraintException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_90,&local_50,&local_70);
  __cxa_throw(this,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyNotNullConstraint(TableCatalogEntry &table, Vector &vector, idx_t count, const string &col_name) {
	if (!VectorOperations::HasNull(vector, count)) {
		return;
	}

	throw ConstraintException("NOT NULL constraint failed: %s.%s", table.name, col_name);
}